

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O3

basic_string_view<char,_std::char_traits<char>_> __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type pos,size_type n)

{
  ulong uVar1;
  logic_error *this_00;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  out_of_range local_20 [16];
  
  uVar1 = this->size_ - pos;
  if (pos <= this->size_) {
    if (uVar1 < n) {
      n = uVar1;
    }
    bVar2.size_ = n;
    bVar2.data_ = this->data_ + pos;
    return bVar2;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(local_20,"nonstd::string_view::substr()");
  std::logic_error::logic_error(this_00,(logic_error *)local_20);
  *(code **)this_00 = std::ostream::_M_insert<long>;
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

nssv_constexpr size_type size()     const nssv_noexcept { return size_; }